

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1010::run(TestCase1010 *this)

{
  StructBuilder other;
  undefined8 uVar1;
  WirePointer *pWVar2;
  char *pcVar3;
  size_t sVar4;
  TransformPromiseNodeBase *this_00;
  char (*params) [9];
  Orphanage OVar5;
  Reader value;
  WaitScope waitScope;
  BuilderFor<capnproto_test::capnp::test::TestTransferCap::Element> e;
  Builder root;
  EventLoop loop;
  MallocMessageBuilder message;
  undefined1 local_3d8 [16];
  WirePointer *local_3c8;
  undefined1 local_3a8 [48];
  WaitScope local_378;
  String local_368;
  OrphanBuilder local_348;
  undefined1 local_328 [24];
  SegmentBuilder *pSStack_310;
  WirePointer *local_300;
  StructBuilder local_2e8;
  ExceptionOrValue local_2b8;
  char local_158;
  EventLoop local_148;
  MallocMessageBuilder local_110;
  
  kj::EventLoop::EventLoop(&local_148);
  local_378.busyPollInterval = 0xffffffff;
  local_378.loop = &local_148;
  kj::EventLoop::enterScope(&local_148);
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_3a8,&local_110.super_MessageBuilder);
  local_2b8.exception.ptr.field_1.value.ownFile.content.size_ = local_3a8._16_8_;
  local_2b8.exception.ptr._0_8_ = local_3a8._0_8_;
  local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)local_3a8._8_8_;
  PointerBuilder::initStruct(&local_2e8,(PointerBuilder *)&local_2b8,(StructSize)0x10000);
  OVar5 = MessageBuilder::getOrphanage(&local_110.super_MessageBuilder);
  params = (char (*) [9])0x20000;
  OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_2b8,OVar5.arena,OVar5.capTable,(StructSize)0x20000);
  local_348.segment = (SegmentBuilder *)local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  local_348.capTable =
       (CapTableBuilder *)local_2b8.exception.ptr.field_1.value.ownFile.content.size_;
  local_348.location = (word *)local_2b8.exception.ptr.field_1.value.ownFile.content.disposer;
  local_348.tag.content = local_2b8.exception.ptr._0_8_;
  OrphanBuilder::asStruct((StructBuilder *)(local_328 + 0x10),&local_348,(StructSize)0x20000);
  local_2b8.exception.ptr._0_8_ = local_328._16_8_;
  local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)pSStack_310;
  local_2b8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_300;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_2b8,value);
  kj::_::Debug::makeDescription<char_const(&)[9]>
            (&local_368,(Debug *)"\"whatever\"","whatever",params);
  kj::Exception::Exception
            ((Exception *)&local_2b8,FAILED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x3fc,&local_368);
  Capability::Client::Client((Client *)(local_3d8 + 8),(Exception *)&local_2b8);
  local_3d8._0_8_ = &Capability::Client::typeinfo;
  local_3a8._16_8_ = local_300 + 1;
  local_3a8._0_8_ = local_328._16_8_;
  local_3a8._8_8_ = pSStack_310;
  PointerBuilder::setCapability
            ((PointerBuilder *)local_3a8,(Own<capnp::ClientHook> *)(local_3d8 + 8));
  pWVar2 = local_3c8;
  if (local_3c8 != (WirePointer *)0x0) {
    local_3c8 = (WirePointer *)0x0;
    (**((CapTableReader *)local_3d8._8_8_)->_vptr_CapTableReader)
              (local_3d8._8_8_,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
  }
  kj::Exception::~Exception((Exception *)&local_2b8);
  sVar4 = local_368.content.size_;
  pcVar3 = local_368.content.ptr;
  if (local_368.content.ptr != (char *)0x0) {
    local_368.content.ptr = (char *)0x0;
    local_368.content.size_ = 0;
    (**(local_368.content.disposer)->_vptr_ArrayDisposer)
              (local_368.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  local_2b8.exception.ptr._0_8_ = local_2e8.segment;
  local_2b8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)local_2e8.capTable;
  local_2b8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_2e8.pointers;
  PointerBuilder::initStructList
            ((ListBuilder *)local_3d8,(PointerBuilder *)&local_2b8,1,(StructSize)0x20000);
  ListBuilder::getStructElement((StructBuilder *)&local_2b8,(ListBuilder *)local_3d8,0);
  OrphanBuilder::asStruct((StructBuilder *)local_3a8,&local_348,(StructSize)0x0);
  other.capTable = (CapTableBuilder *)local_3a8._8_8_;
  other.segment = (SegmentBuilder *)local_3a8._0_8_;
  other.data = (void *)local_3a8._16_8_;
  other.pointers = (WirePointer *)local_3a8._24_8_;
  other.dataSize = local_3a8._32_4_;
  other.pointerCount = local_3a8._36_2_;
  other._38_2_ = local_3a8._38_2_;
  StructBuilder::transferContentFrom((StructBuilder *)&local_2b8,other);
  local_3d8._0_8_ = local_2e8.segment;
  local_3d8._8_8_ = local_2e8.capTable;
  local_3c8 = local_2e8.pointers;
  PointerBuilder::getStructList
            ((ListBuilder *)local_3a8,(PointerBuilder *)local_3d8,(StructSize)0x20000,(word *)0x0);
  ListBuilder::getStructElement((StructBuilder *)&local_2b8,(ListBuilder *)local_3a8,0);
  local_3c8 = (WirePointer *)(local_2b8.exception.ptr.field_1.value.ownFile.content.disposer + 1);
  local_3d8._0_8_ = local_2b8.exception.ptr._0_8_;
  local_3d8._8_8_ = local_2b8.exception.ptr.field_1.value.ownFile.content.ptr;
  PointerBuilder::getCapability((PointerBuilder *)local_328);
  ClientHook::whenResolved((ClientHook *)local_3d8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_3d8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1027:27),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:1029:6)>
             ::anon_class_1_0_00000001_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00609230;
  local_3a8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_0,capnp::_::(anonymous_namespace)::TestCase1010::run()::$_1>>
        ::instance;
  local_2b8.exception.ptr._0_8_ = local_2b8.exception.ptr._0_8_ & 0xffffffffffffff00;
  local_158 = '\0';
  local_3a8._8_8_ = this_00;
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_3a8,&local_2b8,&local_378);
  if (local_158 == '\x01') {
    if (local_2b8.exception.ptr.isSet != false) {
      kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_2b8.exception.ptr.isSet == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_2b8.exception.ptr.field_1.value,0);
  }
  if (local_2b8.exception.ptr.isSet == true) {
    kj::Exception::~Exception(&local_2b8.exception.ptr.field_1.value);
  }
  uVar1 = local_3a8._8_8_;
  if ((TransformPromiseNodeBase *)local_3a8._8_8_ != (TransformPromiseNodeBase *)0x0) {
    local_3a8._8_8_ = (TransformPromiseNodeBase *)0x0;
    (*(code *)((SegmentReader *)local_3a8._0_8_)->arena->_vptr_Arena)
              (local_3a8._0_8_,
               ((PromiseNode *)uVar1)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)uVar1)->_vptr_PromiseNode);
  }
  uVar1 = local_3d8._8_8_;
  if ((SegmentBuilder *)local_3d8._8_8_ != (SegmentBuilder *)0x0) {
    local_3d8._8_8_ = (SegmentBuilder *)0x0;
    (**(code **)*(_func_int **)local_3d8._0_8_)
              (local_3d8._0_8_,
               (_func_int *)
               ((long)((SegmentReader *)uVar1)->arena[-2]._vptr_Arena +
               (long)&((SegmentReader *)uVar1)->arena));
  }
  (*(code *)((SegmentReader *)local_328._0_8_)->arena->_vptr_Arena)
            (local_328._0_8_,
             ((CapTableReader *)local_328._8_8_)->_vptr_CapTableReader[-2] +
             (long)&((CapTableReader *)local_328._8_8_)->_vptr_CapTableReader);
  if (local_348.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_348);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  kj::EventLoop::leaveScope(local_378.loop);
  kj::EventLoop::~EventLoop(&local_148);
  return;
}

Assistant:

TEST(Capability, TransferCap) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestTransferCap>();

  auto orphan = message.getOrphanage().newOrphan<test::TestTransferCap::Element>();
  auto e = orphan.get();
  e.setText("foo");
  e.setCap(KJ_EXCEPTION(FAILED, "whatever"));

  root.initList(1).adoptWithCaveats(0, kj::mv(orphan));

  // This line used to throw due to capability pointers being incorrectly transferred.
  auto cap = root.getList()[0].getCap();

  cap.whenResolved().then([]() {
    KJ_FAIL_EXPECT("didn't throw?");
  }, [](kj::Exception&&) {
    // success
  }).wait(waitScope);
}